

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::FileDescriptorProto::_InternalSerialize
          (FileDescriptorProto *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  _func_int **pp_Var1;
  FileOptions *value;
  SourceCodeInfo *value_00;
  FileDescriptorProto *pFVar2;
  ptrdiff_t pVar3;
  uint32_t uVar4;
  bool bVar5;
  int iVar6;
  Edition value_01;
  uint32_t *puVar7;
  char *pcVar8;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar9;
  void *pvVar10;
  RepeatedPtrField<google::protobuf::DescriptorProto> *this_00;
  const_reference this_01;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *this_02;
  const_reference this_03;
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *this_04;
  const_reference this_05;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_06;
  const_reference this_07;
  RepeatedField<int> *pRVar11;
  const_reference piVar12;
  UnknownFieldSet *unknown_fields;
  byte *pbVar13;
  string_view sVar14;
  string_view local_1d8;
  const_reference local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_1;
  int n_7;
  int i_7;
  char *local_1b0;
  string_view local_1a8;
  string *local_198;
  string *_s_2;
  int n_6;
  int i_6;
  int n_5;
  int i_5;
  FieldDescriptorProto *repfield_3;
  uint n_4;
  uint i_4;
  ServiceDescriptorProto *repfield_2;
  uint n_3;
  uint i_3;
  EnumDescriptorProto *repfield_1;
  uint n_2;
  uint i_2;
  DescriptorProto *repfield;
  uint n_1;
  uint i_1;
  const_reference local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  int n;
  int i;
  char *local_118;
  string_view local_110;
  string *local_100;
  string *_s_1;
  char *local_f0;
  string_view local_e8;
  string *local_d8;
  string *_s;
  FileDescriptorProto *pFStack_c8;
  uint32_t cached_has_bits;
  FileDescriptorProto *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  FileDescriptorProto *this_local;
  char *local_a0;
  size_t local_98;
  ptrdiff_t size_1;
  const_reference local_88;
  uint32_t local_7c;
  FileDescriptorProto *local_78;
  EpsCopyOutputStream *local_70;
  string_view local_68;
  size_t local_58;
  ptrdiff_t size;
  const_reference local_48;
  uint32_t local_3c;
  FileDescriptorProto *local_38;
  EpsCopyOutputStream *local_30;
  byte *local_28;
  uint local_1c;
  byte *local_18;
  uint local_c;
  
  _s._4_4_ = 0;
  pFStack_c8 = this;
  this_ = (FileDescriptorProto *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  puVar7 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  _s._4_4_ = *puVar7;
  if ((_s._4_4_ & 1) != 0) {
    local_d8 = _internal_name_abi_cxx11_(pFStack_c8);
    pcVar8 = (char *)std::__cxx11::string::data();
    iVar6 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_e8,"google.protobuf.FileDescriptorProto.name");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar8,iVar6,SERIALIZE,local_e8);
    pFVar2 = this_;
    sVar14 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_d8);
    local_f0 = sVar14._M_str;
    _s_1 = (string *)sVar14._M_len;
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pFVar2,1,sVar14,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 2) != 0) {
    local_100 = _internal_package_abi_cxx11_(pFStack_c8);
    pcVar8 = (char *)std::__cxx11::string::data();
    iVar6 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_110,"google.protobuf.FileDescriptorProto.package");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar8,iVar6,SERIALIZE,local_110);
    pFVar2 = this_;
    _n = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_100);
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pFVar2,2,_n,(uint8_t *)stream_local);
  }
  s._4_4_ = 0;
  s._0_4_ = _internal_dependency_size(pFStack_c8);
  for (; s._4_4_ < (int)s; s._4_4_ = s._4_4_ + 1) {
    pRVar9 = _internal_dependency_abi_cxx11_(pFStack_c8);
    local_130 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::Get(pRVar9,s._4_4_);
    pcVar8 = (char *)std::__cxx11::string::data();
    iVar6 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&n_1,
               "google.protobuf.FileDescriptorProto.dependency");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar8,iVar6,SERIALIZE,_n_1);
    pFVar2 = this_;
    local_38 = this_;
    local_3c = 3;
    local_48 = local_130;
    size = (ptrdiff_t)stream_local;
    local_58 = std::__cxx11::string::size();
    pVar3 = size;
    bVar5 = true;
    if ((long)local_58 < 0x80) {
      pp_Var1 = (pFVar2->super_Message).super_MessageLite._vptr_MessageLite;
      iVar6 = io::EpsCopyOutputStream::TagSize(local_3c << 3);
      bVar5 = (long)pp_Var1 + (-(long)iVar6 - pVar3) + 0xf < (long)local_58;
    }
    uVar4 = local_3c;
    if (bVar5) {
      sVar14 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_48);
      local_68 = sVar14;
      local_30 = (EpsCopyOutputStream *)
                 io::EpsCopyOutputStream::WriteStringOutline
                           ((EpsCopyOutputStream *)pFVar2,uVar4,sVar14,(uint8_t *)size);
    }
    else {
      local_28 = (byte *)size;
      for (local_1c = local_3c << 3 | 2; 0x7f < local_1c; local_1c = local_1c >> 7) {
        *local_28 = (byte)local_1c | 0x80;
        local_28 = local_28 + 1;
      }
      *local_28 = (byte)local_1c;
      pbVar13 = local_28 + 2;
      local_28[1] = (byte)local_58;
      size = (ptrdiff_t)pbVar13;
      local_28 = local_28 + 1;
      pvVar10 = (void *)std::__cxx11::string::data();
      memcpy(pbVar13,pvVar10,local_58);
      local_30 = (EpsCopyOutputStream *)(size + local_58);
    }
    stream_local = local_30;
  }
  repfield._4_4_ = 0;
  repfield._0_4_ = _internal_message_type_size(pFStack_c8);
  for (; repfield._4_4_ < (uint)repfield; repfield._4_4_ = repfield._4_4_ + 1) {
    this_00 = _internal_message_type(pFStack_c8);
    this_01 = RepeatedPtrField<google::protobuf::DescriptorProto>::Get(this_00,repfield._4_4_);
    _n_2 = this_01;
    iVar6 = DescriptorProto::GetCachedSize(this_01);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (4,(MessageLite *)this_01,iVar6,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  repfield_1._4_4_ = 0;
  repfield_1._0_4_ = _internal_enum_type_size(pFStack_c8);
  for (; repfield_1._4_4_ < (uint)repfield_1; repfield_1._4_4_ = repfield_1._4_4_ + 1) {
    this_02 = _internal_enum_type(pFStack_c8);
    this_03 = RepeatedPtrField<google::protobuf::EnumDescriptorProto>::Get(this_02,repfield_1._4_4_)
    ;
    _n_3 = this_03;
    iVar6 = EnumDescriptorProto::GetCachedSize(this_03);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (5,(MessageLite *)this_03,iVar6,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  repfield_2._4_4_ = 0;
  repfield_2._0_4_ = _internal_service_size(pFStack_c8);
  for (; repfield_2._4_4_ < (uint)repfield_2; repfield_2._4_4_ = repfield_2._4_4_ + 1) {
    this_04 = _internal_service(pFStack_c8);
    this_05 = RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::Get
                        (this_04,repfield_2._4_4_);
    _n_4 = this_05;
    iVar6 = ServiceDescriptorProto::GetCachedSize(this_05);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (6,(MessageLite *)this_05,iVar6,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  repfield_3._4_4_ = 0;
  repfield_3._0_4_ = _internal_extension_size(pFStack_c8);
  for (; repfield_3._4_4_ < (uint)repfield_3; repfield_3._4_4_ = repfield_3._4_4_ + 1) {
    this_06 = _internal_extension(pFStack_c8);
    this_07 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Get
                        (this_06,repfield_3._4_4_);
    _n_5 = this_07;
    iVar6 = FieldDescriptorProto::GetCachedSize(this_07);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (7,(MessageLite *)this_07,iVar6,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  if ((_s._4_4_ & 8) != 0) {
    value = (pFStack_c8->field_0)._impl_.options_;
    iVar6 = FileOptions::GetCachedSize((pFStack_c8->field_0)._impl_.options_);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (8,(MessageLite *)value,iVar6,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  if ((_s._4_4_ & 0x10) != 0) {
    value_00 = (pFStack_c8->field_0)._impl_.source_code_info_;
    iVar6 = SourceCodeInfo::GetCachedSize((pFStack_c8->field_0)._impl_.source_code_info_);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (9,(MessageLite *)value_00,iVar6,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  i_6 = 0;
  n_6 = _internal_public_dependency_size(pFStack_c8);
  for (; i_6 < n_6; i_6 = i_6 + 1) {
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    pRVar11 = _internal_public_dependency(pFStack_c8);
    piVar12 = RepeatedField<int>::Get(pRVar11,i_6);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteInt32ToArray(10,*piVar12,(uint8_t *)stream_local);
  }
  _s_2._4_4_ = 0;
  _s_2._0_4_ = _internal_weak_dependency_size(pFStack_c8);
  for (; _s_2._4_4_ < (int)_s_2; _s_2._4_4_ = _s_2._4_4_ + 1) {
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    pRVar11 = _internal_weak_dependency(pFStack_c8);
    piVar12 = RepeatedField<int>::Get(pRVar11,_s_2._4_4_);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteInt32ToArray(0xb,*piVar12,(uint8_t *)stream_local)
    ;
  }
  if ((_s._4_4_ & 4) != 0) {
    local_198 = _internal_syntax_abi_cxx11_(pFStack_c8);
    pcVar8 = (char *)std::__cxx11::string::data();
    iVar6 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1a8,"google.protobuf.FileDescriptorProto.syntax");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar8,iVar6,SERIALIZE,local_1a8);
    pFVar2 = this_;
    _n_7 = (string_view)
           std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_198);
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pFVar2,0xc,_n_7,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x20) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    value_01 = _internal_edition(pFStack_c8);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteEnumToArray(0xe,value_01,(uint8_t *)stream_local);
  }
  s_1._4_4_ = 0;
  s_1._0_4_ = _internal_option_dependency_size(pFStack_c8);
  for (; s_1._4_4_ < (int)s_1; s_1._4_4_ = s_1._4_4_ + 1) {
    pRVar9 = _internal_option_dependency_abi_cxx11_(pFStack_c8);
    local_1c8 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::Get(pRVar9,s_1._4_4_);
    pcVar8 = (char *)std::__cxx11::string::data();
    iVar6 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1d8,"google.protobuf.FileDescriptorProto.option_dependency");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar8,iVar6,SERIALIZE,local_1d8);
    pFVar2 = this_;
    local_78 = this_;
    local_7c = 0xf;
    local_88 = local_1c8;
    size_1 = (ptrdiff_t)stream_local;
    local_98 = std::__cxx11::string::size();
    pVar3 = size_1;
    bVar5 = true;
    if ((long)local_98 < 0x80) {
      pp_Var1 = (pFVar2->super_Message).super_MessageLite._vptr_MessageLite;
      iVar6 = io::EpsCopyOutputStream::TagSize(local_7c << 3);
      bVar5 = (long)pp_Var1 + (-(long)iVar6 - pVar3) + 0xf < (long)local_98;
    }
    uVar4 = local_7c;
    if (bVar5) {
      sVar14 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_88);
      local_a0 = sVar14._M_str;
      this_local = (FileDescriptorProto *)sVar14._M_len;
      local_70 = (EpsCopyOutputStream *)
                 io::EpsCopyOutputStream::WriteStringOutline
                           ((EpsCopyOutputStream *)pFVar2,uVar4,sVar14,(uint8_t *)size_1);
    }
    else {
      local_18 = (byte *)size_1;
      for (local_c = local_7c << 3 | 2; 0x7f < local_c; local_c = local_c >> 7) {
        *local_18 = (byte)local_c | 0x80;
        local_18 = local_18 + 1;
      }
      *local_18 = (byte)local_c;
      pbVar13 = local_18 + 2;
      local_18[1] = (byte)local_98;
      size_1 = (ptrdiff_t)pbVar13;
      local_18 = local_18 + 1;
      pvVar10 = (void *)std::__cxx11::string::data();
      memcpy(pbVar13,pvVar10,local_98);
      local_70 = (EpsCopyOutputStream *)(size_1 + local_98);
    }
    stream_local = local_70;
  }
  bVar5 = internal::InternalMetadata::have_unknown_fields
                    (&(pFStack_c8->super_Message).super_MessageLite._internal_metadata_);
  if (bVar5) {
    unknown_fields =
         internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(pFStack_c8->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL FileDescriptorProto::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const FileDescriptorProto& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FileDescriptorProto)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional string name = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_name();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FileDescriptorProto.name");
    target = stream->WriteStringMaybeAliased(1, _s, target);
  }

  // optional string package = 2;
  if ((cached_has_bits & 0x00000002u) != 0) {
    const ::std::string& _s = this_._internal_package();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FileDescriptorProto.package");
    target = stream->WriteStringMaybeAliased(2, _s, target);
  }

  // repeated string dependency = 3;
  for (int i = 0, n = this_._internal_dependency_size(); i < n; ++i) {
    const auto& s = this_._internal_dependency().Get(i);
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(s.data(), static_cast<int>(s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FileDescriptorProto.dependency");
    target = stream->WriteString(3, s, target);
  }

  // repeated .google.protobuf.DescriptorProto message_type = 4;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_message_type_size());
       i < n; i++) {
    const auto& repfield = this_._internal_message_type().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            4, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_enum_type_size());
       i < n; i++) {
    const auto& repfield = this_._internal_enum_type().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            5, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.ServiceDescriptorProto service = 6;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_service_size());
       i < n; i++) {
    const auto& repfield = this_._internal_service().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            6, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 7;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_extension_size());
       i < n; i++) {
    const auto& repfield = this_._internal_extension().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            7, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // optional .google.protobuf.FileOptions options = 8;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        8, *this_._impl_.options_, this_._impl_.options_->GetCachedSize(), target,
        stream);
  }

  // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
  if ((cached_has_bits & 0x00000010u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        9, *this_._impl_.source_code_info_, this_._impl_.source_code_info_->GetCachedSize(), target,
        stream);
  }

  // repeated int32 public_dependency = 10;
  for (int i = 0, n = this_._internal_public_dependency_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        10, this_._internal_public_dependency().Get(i), target);
  }

  // repeated int32 weak_dependency = 11;
  for (int i = 0, n = this_._internal_weak_dependency_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        11, this_._internal_weak_dependency().Get(i), target);
  }

  // optional string syntax = 12;
  if ((cached_has_bits & 0x00000004u) != 0) {
    const ::std::string& _s = this_._internal_syntax();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FileDescriptorProto.syntax");
    target = stream->WriteStringMaybeAliased(12, _s, target);
  }

  // optional .google.protobuf.Edition edition = 14;
  if ((cached_has_bits & 0x00000020u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        14, this_._internal_edition(), target);
  }

  // repeated string option_dependency = 15;
  for (int i = 0, n = this_._internal_option_dependency_size(); i < n; ++i) {
    const auto& s = this_._internal_option_dependency().Get(i);
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(s.data(), static_cast<int>(s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FileDescriptorProto.option_dependency");
    target = stream->WriteString(15, s, target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FileDescriptorProto)
  return target;
}